

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeCheckerVisitor.cpp
# Opt level: O0

void __thiscall
hdc::TypeCheckerVisitor::visit(TypeCheckerVisitor *this,GreaterThanExpression *expression)

{
  Expression *pEVar1;
  BoolType *this_00;
  Type *local_30;
  Type *type;
  Type *right;
  Type *left;
  GreaterThanExpression *expression_local;
  TypeCheckerVisitor *this_local;
  
  pEVar1 = BinaryOperator::getLeft(&expression->super_BinaryOperator);
  (**(pEVar1->super_Statement).super_ASTNode._vptr_ASTNode)(pEVar1,this);
  pEVar1 = BinaryOperator::getRight(&expression->super_BinaryOperator);
  (**(pEVar1->super_Statement).super_ASTNode._vptr_ASTNode)(pEVar1,this);
  this_00 = (BoolType *)operator_new(0x78);
  BoolType::BoolType(this_00);
  Expression::setType((Expression *)expression,(Type *)this_00);
  this->lastType = local_30;
  return;
}

Assistant:

void TypeCheckerVisitor::visit(GreaterThanExpression* expression) {
    Type* left;
    Type* right;
    Type* type;

    expression->getLeft()->accept(this);
    left = lastType;

    expression->getRight()->accept(this);
    right = lastType;

    expression->setType(new BoolType());
    lastType = type;
}